

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O2

double __thiscall
RandomGen::rand_exponential(RandomGen *this,double half_life,double t_min,double t_max)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = rand_uniform(this);
  dVar3 = 0.0;
  if (0.0 <= t_min) {
    dVar3 = exp((t_min * -0.6931471805599453) / half_life);
    dVar3 = 1.0 - dVar3;
  }
  dVar2 = 1.0;
  if (0.0 <= t_max) {
    dVar2 = exp((t_max * -0.6931471805599453) / half_life);
    dVar2 = 1.0 - dVar2;
  }
  dVar1 = log(1.0 - ((dVar2 - dVar3) * dVar1 + dVar3));
  return (dVar1 * half_life) / -0.6931471805599453;
}

Assistant:

double RandomGen::rand_exponential(double half_life, double t_min,
                                   double t_max) {
  double r = rand_uniform();
  double r_min = 0;
  double r_max = 1;
  if (t_min >= 0) {
    r_min = 1 - exp(-t_min * log2 / half_life);
  }
  if (t_max >= 0) {
    r_max = 1 - exp(-t_max * log2 / half_life);
  }
  r = (r_max - r_min) * r + r_min;
  return -log(1 - r) * half_life / log2;
}